

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::
     pair_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>(string *type,Module *m)

{
  Type_Info ti;
  Module *pMVar1;
  string local_110;
  Proxy_Function local_f0;
  allocator<char> local_d9;
  string local_d8;
  offset_in_pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_to_Boxed_Value local_b8;
  Proxy_Function local_b0;
  allocator<char> local_99;
  string local_98;
  offset_in_pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_to_Boxed_Value local_78;
  Proxy_Function local_70 [2];
  string local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  user_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>();
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  ti.m_bare_type_info = (type_info *)uStack_28;
  ti.m_type_info = (type_info *)local_30;
  ti._16_8_ = local_20;
  Module::add(m,ti,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pMVar1 = local_18;
  local_78 = 0;
  fun<chaiscript::Boxed_Value_std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::*>
            ((chaiscript *)local_70,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"first",&local_99);
  Module::add(pMVar1,local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_70);
  pMVar1 = local_18;
  local_b8 = 0x10;
  fun<chaiscript::Boxed_Value_std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::*>
            ((chaiscript *)&local_b0,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"second",&local_d9);
  Module::add(pMVar1,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b0);
  basic_constructors<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            ((string *)m_local,local_18);
  pMVar1 = local_18;
  constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)>
            ();
  std::__cxx11::string::string
            ((string *)&local_110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  Module::add(pMVar1,&local_f0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_f0);
  return;
}

Assistant:

void pair_type(const std::string &type, Module &m) {
    m.add(user_type<PairType>(), type);

    m.add(fun(&PairType::first), "first");
    m.add(fun(&PairType::second), "second");

    basic_constructors<PairType>(type, m);
    m.add(constructor<PairType(const typename PairType::first_type &, const typename PairType::second_type &)>(), type);
  }